

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_string_field.cc
# Opt level: O2

void google::protobuf::compiler::cxx::anon_unknown_3::SetStringVariables
               (FieldDescriptor *descriptor,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *variables,Options *options)

{
  long lVar1;
  mapped_type *pmVar2;
  FieldDescriptor *field;
  unsigned_long i;
  FieldDescriptor *field_00;
  allocator<char> local_a1;
  string local_a0;
  key_type local_80;
  string local_60;
  key_type local_40;
  
  SetCommonFieldVariables(descriptor,variables,options);
  DefaultValue_abi_cxx11_(&local_a0,(cxx *)descriptor,field);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"default",(allocator<char> *)&local_60);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_80);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  SimpleItoa_abi_cxx11_(&local_a0,*(protobuf **)(*(long *)(descriptor + 0x70) + 8),i);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"default_length",(allocator<char> *)&local_60);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_80);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  lVar1 = *(long *)(*(long *)(descriptor + 0x70) + 8);
  if (lVar1 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"&::google::protobuf::internal::kEmptyString",
               (allocator<char> *)&local_80);
  }
  else {
    FieldName_abi_cxx11_(&local_60,(cxx *)descriptor,field_00);
    std::operator+(&local_80,"_default_",&local_60);
    std::operator+(&local_a0,&local_80,"_");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"default_variable",&local_a1);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_40);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_a0);
  if (lVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"pointer_type",(allocator<char> *)&local_40);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](variables,&local_a0);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_a0);
  return;
}

Assistant:

void SetStringVariables(const FieldDescriptor* descriptor,
                        map<string, string>* variables,
                        const Options& options) {
  SetCommonFieldVariables(descriptor, variables, options);
  (*variables)["default"] = DefaultValue(descriptor);
  (*variables)["default_length"] =
      SimpleItoa(descriptor->default_value_string().length());
  (*variables)["default_variable"] = descriptor->default_value_string().empty()
      ? "&::google::protobuf::internal::kEmptyString"
      : "_default_" + FieldName(descriptor) + "_";
  (*variables)["pointer_type"] =
      descriptor->type() == FieldDescriptor::TYPE_BYTES ? "void" : "char";
}